

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O1

Location __thiscall cmJSONState::LocateInDocument(cmJSONState *this,ptrdiff_t offset)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  Location LVar4;
  Location LVar5;
  int iVar6;
  long lVar7;
  
  if (offset == 0) {
    LVar5.line = 1;
    LVar5.column = 1;
    return LVar5;
  }
  pcVar2 = (this->doc)._M_dataplus._M_p;
  iVar3 = 1;
  lVar7 = 0;
  iVar6 = 1;
  do {
    cVar1 = pcVar2[lVar7];
    if (cVar1 == '\n') {
LAB_002bc788:
      iVar3 = iVar3 + 1;
      iVar6 = 1;
    }
    else if (cVar1 == '\r') {
      if ((offset + -1 == lVar7) || (pcVar2[lVar7 + 1] != '\n')) goto LAB_002bc788;
    }
    else {
      iVar6 = iVar6 + 1;
    }
    lVar7 = lVar7 + 1;
    if (offset == lVar7) {
      LVar4.column = iVar6;
      LVar4.line = iVar3;
      return LVar4;
    }
  } while( true );
}

Assistant:

cmJSONState::Location cmJSONState::LocateInDocument(ptrdiff_t offset)
{
  int line = 1;
  int col = 1;
  const char* beginDoc = doc.data();
  const char* last = beginDoc + offset;
  for (; beginDoc != last; ++beginDoc) {
    switch (*beginDoc) {
      case '\r':
        if (beginDoc + 1 != last && beginDoc[1] == '\n') {
          continue; // consume CRLF as a single token.
        }
        CM_FALLTHROUGH; // CR without a following LF is same as LF
      case '\n':
        col = 1;
        ++line;
        break;
      default:
        ++col;
        break;
    }
  }
  return { line, col };
}